

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBiasLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  string *this_00;
  void *pvVar1;
  bool bVar2;
  WeightParamType WVar3;
  uint uVar4;
  uint64_t uVar5;
  Result *_result;
  int i;
  int index;
  undefined1 *puVar6;
  uint64_t expectedUnits;
  undefined1 *puVar7;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  uint64_t local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar2 = Result::good(__return_storage_ptr__);
  if (!bVar2) {
    return __return_storage_ptr__;
  }
  this_00 = &__return_storage_ptr__->m_message;
  std::__cxx11::string::~string((string *)this_00);
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar2 = Result::good(__return_storage_ptr__);
  if (!bVar2) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)this_00);
  if (this->ndArrayInterpretation == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Bias",(allocator<char> *)&err);
    validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_50,&this->blobNameToRank);
    std::__cxx11::string::~string((string *)&local_50);
    bVar2 = Result::good(__return_storage_ptr__);
    if (!bVar2) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&err,"Bias",(allocator<char> *)&local_d8);
    validateRankCount(__return_storage_ptr__,layer,&err,3,-1,&this->blobNameToRank);
    std::__cxx11::string::~string((string *)&err);
    bVar2 = Result::good(__return_storage_ptr__);
    if (!bVar2) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  if (layer->_oneof_case_[0] == 0xfa) {
    puVar7 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar7 = Specification::_BiasLayerParams_default_instance_;
  }
  puVar6 = (undefined1 *)((BatchnormLayerParams *)puVar7)->variance_;
  if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
    puVar6 = Specification::_WeightParams_default_instance_;
  }
  WVar3 = valueType((WeightParams *)puVar6);
  if (WVar3 == UNSPECIFIED) {
    std::operator+(&local_d8,"Bias product layer \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    std::operator+(&err,&local_d8,
                   "\' has both full precision and half precision weights and/or bias fields populated"
                  );
    std::__cxx11::string::~string((string *)&local_d8);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
  }
  else {
    uVar4 = (((ConvolutionLayerParams *)puVar7)->kernelsize_).current_size_;
    if ((uVar4 | 2) == 3) {
      expectedUnits = 1;
      for (index = 0; index < (int)uVar4; index = index + 1) {
        uVar5 = Specification::BiasLayerParams::_internal_shape((BiasLayerParams *)puVar7,index);
        expectedUnits = expectedUnits * uVar5;
        uVar4 = (((ConvolutionLayerParams *)puVar7)->kernelsize_).current_size_;
      }
      if ((uVar4 == 3) &&
         (uVar5 = Specification::BiasLayerParams::_internal_shape((BiasLayerParams *)puVar7,0),
         1 < uVar5)) {
        puVar6 = (undefined1 *)((BatchnormLayerParams *)puVar7)->variance_;
        if ((WeightParams *)puVar6 == (WeightParams *)0x0) {
          puVar6 = Specification::_WeightParams_default_instance_;
        }
        local_b8 = Specification::BiasLayerParams::_internal_shape((BiasLayerParams *)puVar7,0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&err,"Bias",(allocator<char> *)&local_b0);
        pvVar1 = (layer->name_).tagged_ptr_.ptr_;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,"bias",(allocator<char> *)&local_90);
        validateGeneralWeightParams
                  (__return_storage_ptr__,(WeightParams *)puVar6,expectedUnits,local_b8,&err,
                   (string *)((ulong)pvVar1 & 0xfffffffffffffffe),&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&err);
        bVar2 = Result::good(__return_storage_ptr__);
      }
      else {
        puVar7 = (undefined1 *)((BatchnormLayerParams *)puVar7)->variance_;
        if ((WeightParams *)puVar7 == (WeightParams *)0x0) {
          puVar7 = Specification::_WeightParams_default_instance_;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&err,"Bias",(allocator<char> *)&local_b0);
        pvVar1 = (layer->name_).tagged_ptr_.ptr_;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,"bias",(allocator<char> *)&local_90);
        validateGeneralWeightParams
                  (__return_storage_ptr__,(WeightParams *)puVar7,expectedUnits,1,&err,
                   (string *)((ulong)pvVar1 & 0xfffffffffffffffe),&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&err);
        bVar2 = Result::good(__return_storage_ptr__);
      }
      if (bVar2 == false) {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::~string((string *)this_00);
      Result::Result(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    std::operator+(&local_90,"Bias layer \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
    std::operator+(&local_b0,&local_90,"\' cannot be ");
    std::__cxx11::to_string
              (&local_70,(((ConvolutionLayerParams *)puVar7)->kernelsize_).current_size_);
    std::operator+(&local_d8,&local_b0,&local_70);
    std::operator+(&err,&local_d8," dimensional. Must be 1D or 3D.");
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
  }
  std::__cxx11::string::~string((string *)&err);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBiasLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Bias", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Bias", 3, -1, blobNameToRank));
    }

    const auto& params = layer.bias();
    WeightParamType paramType = valueType(params.bias());

    // Only float32 or float16 parameters can be populated at any time
    if (paramType == UNSPECIFIED) {
        std::string err = "Bias product layer '" + layer.name() + "' has both full precision and half precision weights and/or bias fields populated";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (params.shape_size() != 1 && params.shape_size() != 3) {
        std::string err = "Bias layer '" + layer.name() + "' cannot be " + std::to_string(params.shape_size()) + " dimensional. Must be 1D or 3D.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // shape can be ``[1]``, ``[C]``, ``[1, H, W]`` or ``[C, H, W]``
    size_t total_shape = 1;
    for (int i = 0; i < params.shape_size(); i++) {
        total_shape *= params.shape(i);
    }
    if (params.shape_size() == 3 && params.shape(0) > 1){
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.bias(), total_shape, params.shape(0), "Bias", layer.name(), "bias"));
    } else {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(params.bias(), total_shape, 1, "Bias", layer.name(), "bias"));
    }

    return Result();
}